

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int mem_av_trans_func(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  bitmap_t dst;
  int iVar1;
  mem_expr_t pmVar2;
  MIR_insn_t local_78;
  bitmap_t prev_mem_av_out;
  bitmap_iterator_t bi2;
  bitmap_iterator_t bi;
  MIR_op_t *mem_ref;
  MIR_insn_t mem_insn;
  MIR_insn_t insn;
  size_t nel2;
  size_t nel;
  bb_t_conflict pbStack_18;
  int alias_p;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  dst = gen_ctx->temp_bitmap;
  pbStack_18 = bb;
  bb_local = (bb_t_conflict)gen_ctx;
  bitmap_copy(dst,bb->out);
  bitmap_copy(pbStack_18->out,pbStack_18->gen);
  if (pbStack_18->call_p == '\0') {
    bitmap_iterator_init((bitmap_iterator_t *)&bi2.nbit,pbStack_18->in);
    while (iVar1 = bitmap_iterator_next((bitmap_iterator_t *)&bi2.nbit,&nel2), iVar1 != 0) {
      nel._4_4_ = 0;
      pmVar2 = VARR_mem_expr_tget(*(VARR_mem_expr_t **)(bb_local[2].index + 0x10),nel2);
      local_78 = pmVar2->insn;
      if ((*(ushort *)&local_78->ops[0].field_0x8 & 0xff) == 0xb) {
        local_78 = (MIR_insn_t)local_78->ops;
      }
      else {
        local_78 = local_78 + 1;
      }
      bitmap_iterator_init((bitmap_iterator_t *)&prev_mem_av_out,pbStack_18->gen);
      do {
        iVar1 = bitmap_iterator_next((bitmap_iterator_t *)&prev_mem_av_out,(size_t *)&insn);
        if (iVar1 == 0) goto LAB_0014c92e;
        pmVar2 = VARR_mem_expr_tget(*(VARR_mem_expr_t **)(bb_local[2].index + 0x10),(size_t)insn);
      } while (((*(ushort *)&pmVar2->insn->ops[0].field_0x8 & 0xff) != 0xb) ||
              (iVar1 = may_mem_alias_p((MIR_op_t *)local_78,pmVar2->insn->ops), iVar1 == 0));
      nel._4_4_ = 1;
LAB_0014c92e:
      if (nel._4_4_ == 0) {
        bitmap_set_bit_p(pbStack_18->out,nel2);
      }
    }
  }
  iVar1 = bitmap_equal_p(pbStack_18->out,dst);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int mem_av_trans_func (gen_ctx_t gen_ctx, bb_t bb) {
  int alias_p;
  size_t nel, nel2;
  MIR_insn_t insn, mem_insn;
  MIR_op_t *mem_ref;
  bitmap_iterator_t bi, bi2;
  bitmap_t prev_mem_av_out = temp_bitmap;

  bitmap_copy (prev_mem_av_out, bb->mem_av_out);
  bitmap_copy (bb->mem_av_out, bb->gen);
  if (!bb->call_p) {
    FOREACH_BITMAP_BIT (bi, bb->mem_av_in, nel) {
      alias_p = FALSE;
      insn = VARR_GET (mem_expr_t, mem_exprs, nel)->insn;
      mem_ref = insn->ops[0].mode == MIR_OP_VAR_MEM ? &insn->ops[0] : &insn->ops[1];
      FOREACH_BITMAP_BIT (bi2, bb->gen, nel2) { /* consider only stores */
        mem_insn = VARR_GET (mem_expr_t, mem_exprs, nel2)->insn;
        if (mem_insn->ops[0].mode == MIR_OP_VAR_MEM
            && may_mem_alias_p (mem_ref, &mem_insn->ops[0])) {
          alias_p = TRUE;
          break;
        }
      }
      if (!alias_p) bitmap_set_bit_p (bb->mem_av_out, nel);
    }
  }
  return !bitmap_equal_p (bb->mem_av_out, prev_mem_av_out);
}